

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.c
# Opt level: O0

uint64_t compute_cdef_dist(void *dst,int dstride,uint16_t *src,cdef_list *dlist,int cdef_count,
                          BLOCK_SIZE bsize,int coeff_shift,int row,int col)

{
  int iVar1;
  int iVar2;
  uint16_t *puVar3;
  uint8_t *puVar4;
  uint64_t uVar5;
  cdef_list *in_RCX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  BLOCK_SIZE in_R9B;
  uint8_t *dst_tmp;
  uint16_t *src_tmp;
  int num_blks;
  int height_log2;
  int width_log2;
  int height;
  int width;
  int src_stride;
  uint8_t *dst_buff;
  uint8_t *dst8;
  int inc;
  int iter;
  int by;
  int bx;
  int bi;
  uint64_t sum;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  long local_58;
  int local_44;
  int local_40;
  uint local_3c;
  uint local_38;
  int local_34;
  ulong local_30;
  int local_24;
  cdef_list *local_20;
  long local_18;
  int local_c;
  
  local_30 = 0;
  local_40 = 0;
  local_44 = 1;
  local_58 = in_RDI + ((int)src_tmp * in_ESI + num_blks);
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  init_src_params(&local_5c,&local_60,&local_64,&local_68,&local_6c,in_R9B);
  iVar1 = (int)(0x10 / (long)local_60);
  for (local_34 = 0; local_34 < local_24; local_34 = local_44 + local_34) {
    local_3c = (uint)local_20[local_34].by;
    local_38 = (uint)local_20[local_34].bx;
    puVar3 = (uint16_t *)
             (local_18 + (long)(local_34 << ((byte)local_6c + (byte)local_68 & 0x1f)) * 2);
    puVar4 = (uint8_t *)
             (local_58 +
             (int)((local_3c << ((byte)local_6c & 0x1f)) * local_c +
                  (local_38 << ((byte)local_68 & 0x1f))));
    iVar2 = is_dual_or_quad_applicable(local_20,local_60,local_24,local_34,local_40);
    if (iVar2 == 0) {
      uVar5 = (*aom_mse_wxh_16bit)(puVar4,local_c,puVar3,local_5c,local_60,local_64);
      local_30 = uVar5 + local_30;
      local_40 = local_40 + 1;
      local_44 = 1;
    }
    else {
      uVar5 = (*aom_mse_16xh_16bit)(puVar4,local_c,puVar3,local_60,local_64);
      local_30 = uVar5 + local_30;
      local_40 = iVar1 + local_40;
      local_44 = iVar1;
    }
  }
  return local_30 >> (((byte)dst_tmp & 0x1f) << 1);
}

Assistant:

static uint64_t compute_cdef_dist(void *dst, int dstride, uint16_t *src,
                                  cdef_list *dlist, int cdef_count,
                                  BLOCK_SIZE bsize, int coeff_shift, int row,
                                  int col) {
  assert(bsize == BLOCK_4X4 || bsize == BLOCK_4X8 || bsize == BLOCK_8X4 ||
         bsize == BLOCK_8X8);
  uint64_t sum = 0;
  int bi, bx, by;
  int iter = 0;
  int inc = 1;
  uint8_t *dst8 = (uint8_t *)dst;
  uint8_t *dst_buff = &dst8[row * dstride + col];
  int src_stride, width, height, width_log2, height_log2;
  init_src_params(&src_stride, &width, &height, &width_log2, &height_log2,
                  bsize);

  const int num_blks = 16 / width;
  for (bi = 0; bi < cdef_count; bi += inc) {
    by = dlist[bi].by;
    bx = dlist[bi].bx;
    uint16_t *src_tmp = &src[bi << (height_log2 + width_log2)];
    uint8_t *dst_tmp =
        &dst_buff[(by << height_log2) * dstride + (bx << width_log2)];

    if (is_dual_or_quad_applicable(dlist, width, cdef_count, bi, iter)) {
      sum += aom_mse_16xh_16bit(dst_tmp, dstride, src_tmp, width, height);
      iter += num_blks;
      inc = num_blks;
    } else {
      sum += aom_mse_wxh_16bit(dst_tmp, dstride, src_tmp, src_stride, width,
                               height);
      iter += 1;
      inc = 1;
    }
  }

  return sum >> 2 * coeff_shift;
}